

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O2

field_t * __thiscall
cfgfile::generator::cfg::tag_base_class_t::cfg
          (field_t *__return_storage_ptr__,tag_base_class_t *this)

{
  pos_t pVar1;
  bool bVar2;
  field_type_t fVar3;
  undefined1 local_48 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_30;
  
  field_t::field_t(__return_storage_ptr__);
  __return_storage_ptr__->m_is_base = true;
  fVar3 = field_type_from_string
                    (&(this->
                      super_tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
                      ).m_value);
  __return_storage_ptr__->m_type = fVar3;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->m_name);
  pVar1 = (this->
          super_tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
          ).super_tag_t<cfgfile::string_trait_t>.m_column_number;
  __return_storage_ptr__->m_line_number =
       (this->
       super_tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
       ).super_tag_t<cfgfile::string_trait_t>.m_line_number;
  __return_storage_ptr__->m_column_number = pVar1;
  bVar2 = tag_t<cfgfile::string_trait_t>::is_defined
                    (&(this->m_value_type).super_tag_t<cfgfile::string_trait_t>);
  if (bVar2) {
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->m_value_type);
  }
  bVar2 = tag_t<cfgfile::string_trait_t>::is_defined
                    (&(this->m_is_required).super_tag_t<cfgfile::string_trait_t>);
  if (bVar2) {
    __return_storage_ptr__->m_is_required = true;
  }
  bVar2 = tag_t<cfgfile::string_trait_t>::is_defined
                    (&(this->m_default_value).super_tag_t<cfgfile::string_trait_t>);
  if (bVar2) {
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->m_default_value);
  }
  check_constraints((tag_t<cfgfile::string_trait_t> *)&this->m_min_max_constraint,
                    (tag_t<cfgfile::string_trait_t> *)&this->m_one_of_constraint,
                    &((this->
                      super_tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
                      ).super_tag_t<cfgfile::string_trait_t>.m_parent)->m_name,
                    &(this->m_name).m_value);
  bVar2 = tag_t<cfgfile::string_trait_t>::is_defined
                    ((tag_t<cfgfile::string_trait_t> *)&this->m_min_max_constraint);
  if (bVar2) {
    tag_min_max_constraint_t::cfg((tag_min_max_constraint_t *)local_48);
  }
  else {
    bVar2 = tag_t<cfgfile::string_trait_t>::is_defined
                      ((tag_t<cfgfile::string_trait_t> *)&this->m_one_of_constraint);
    if (!bVar2) {
      return __return_storage_ptr__;
    }
    tag_one_of_constraint_t::cfg((tag_one_of_constraint_t *)local_48);
  }
  local_48._16_8_ = local_48._0_8_;
  aStack_30._M_allocated_capacity = local_48._8_8_;
  local_48._0_8_ = (_func_int **)0x0;
  local_48._8_8_ = (pointer)0x0;
  std::__shared_ptr<cfgfile::generator::cfg::constraint_base_t,_(__gnu_cxx::_Lock_policy)2>::
  operator=(&(__return_storage_ptr__->m_constraint).
             super___shared_ptr<cfgfile::generator::cfg::constraint_base_t,_(__gnu_cxx::_Lock_policy)2>
            ,(__shared_ptr<cfgfile::generator::cfg::constraint_base_t,_(__gnu_cxx::_Lock_policy)2> *
             )(local_48 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_30._M_allocated_capacity);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  return __return_storage_ptr__;
}

Assistant:

field_t
tag_base_class_t::cfg() const
{
	field_t f;
	f.set_base( true );
	f.set_type( field_type_from_string( value() ) );
	f.set_name( m_name.value() );
	f.set_line_number( line_number() );
	f.set_column_number( column_number() );

	if( m_value_type.is_defined() )
		f.set_value_type( m_value_type.value() );

	if( m_is_required.is_defined() )
		f.set_required();

	if( m_default_value.is_defined() )
		f.set_default_value( m_default_value.value() );

	const tag_class_t * c = static_cast< const tag_class_t* > ( parent() );

	check_constraints( m_min_max_constraint, m_one_of_constraint,
		c->name(), m_name.value() );

	if( m_min_max_constraint.is_defined() )
		f.set_constraint( m_min_max_constraint.cfg() );
	else if( m_one_of_constraint.is_defined() )
		f.set_constraint( m_one_of_constraint.cfg() );

	return f;
}